

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::ReadInvalidModule
          (CommandRunner *this,int line_number,string_view module_filename,ModuleType module_type,
          char *desc)

{
  Result RVar1;
  CommandRunner *this_00;
  bool bVar2;
  Ptr module;
  string header;
  Errors errors;
  Ptr local_88;
  undefined1 local_68 [32];
  Errors local_48;
  
  this_00 = (CommandRunner *)local_68;
  wabt::StringPrintf_abi_cxx11_
            ((string *)this_00,"%s:%d: %s passed",(this->source_filename_)._M_dataplus._M_p,
             line_number,desc);
  if (module_type == Binary) {
    local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ReadModule(&local_88,this,module_filename,&local_48);
    bVar2 = local_88.obj_ == (Module *)0x0;
    if (bVar2) {
      wabt::FormatErrorsToFile
                (&local_48,Binary,(LexerSourceLineFinder *)0x0,_stdout,(string *)local_68,Once,0x50)
      ;
    }
    RVar1.enum_ = (Enum)bVar2;
    if (local_88.obj_ != (Module *)0x0) {
      wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
      local_88.obj_ = (Module *)0x0;
      local_88.store_ = (Store *)0x0;
      local_88.root_index_ = 0;
    }
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_48);
  }
  else {
    if (module_type != Text) {
      abort();
    }
    RVar1 = ReadTextModule(this_00,module_filename,(string *)local_68,true);
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidModule(int line_number,
                                              std::string_view module_filename,
                                              ModuleType module_type,
                                              const char* desc) {
  std::string header = StringPrintf(
      "%s:%d: %s passed", source_filename_.c_str(), line_number, desc);

  switch (module_type) {
    case ModuleType::Text: {
      return ReadTextModule(module_filename, header, true);
    }

    case ModuleType::Binary: {
      Errors errors;
      auto module = ReadModule(module_filename, &errors);
      if (!module) {
        FormatErrorsToFile(errors, Location::Type::Binary, {}, stdout, header,
                           PrintHeader::Once);
        return wabt::Result::Error;
      } else {
        return wabt::Result::Ok;
      }
    }
  }

  WABT_UNREACHABLE;
}